

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O1

void __thiscall leveldb::TableBuilder::~TableBuilder(TableBuilder *this)

{
  FilterBlockBuilder *pFVar1;
  pointer puVar2;
  pointer pSVar3;
  pointer pcVar4;
  pointer puVar5;
  Rep *this_00;
  
  if (this->rep_->closed == false) {
    __assert_fail("rep_->closed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/table_builder.cc"
                  ,0x49,"leveldb::TableBuilder::~TableBuilder()");
  }
  pFVar1 = this->rep_->filter_block;
  if (pFVar1 != (FilterBlockBuilder *)0x0) {
    puVar2 = (pFVar1->filter_offsets_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    pSVar3 = (pFVar1->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar3 != (pointer)0x0) {
      operator_delete(pSVar3);
    }
    pcVar4 = (pFVar1->result_)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != &(pFVar1->result_).field_2) {
      operator_delete(pcVar4);
    }
    puVar5 = (pFVar1->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar5 != (pointer)0x0) {
      operator_delete(puVar5);
    }
    pcVar4 = (pFVar1->keys_)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != &(pFVar1->keys_).field_2) {
      operator_delete(pcVar4);
    }
    operator_delete(pFVar1);
  }
  this_00 = this->rep_;
  if (this_00 != (Rep *)0x0) {
    Rep::~Rep(this_00);
    operator_delete(this_00);
    return;
  }
  return;
}

Assistant:

TableBuilder::~TableBuilder() {
  assert(rep_->closed);  // Catch errors where caller forgot to call Finish()
  delete rep_->filter_block;
  delete rep_;
}